

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O2

void __thiscall mjs::gc_heap::allocation_context::run_destructors(allocation_context *this)

{
  slot_allocation_header sVar1;
  uint index;
  gc_type_info *pgVar2;
  uint uVar3;
  
  for (uVar3 = this->start_; uVar3 < this->next_free_; uVar3 = uVar3 + sVar1.size) {
    sVar1 = this->storage_[uVar3].allocation;
    index = sVar1.type;
    if (index >> 1 < 0x7fffffff) {
      pgVar2 = gc_type_info::from_index(index);
      if (pgVar2->destroy_ != (destroy_function)0x0) {
        (*pgVar2->destroy_)(this->storage_ + (ulong)uVar3 + 1);
      }
    }
  }
  this->next_free_ = this->start_;
  return;
}

Assistant:

void gc_heap::allocation_context::run_destructors() {
    for (uint32_t pos = start_; pos < next_free_;) {
        const auto a = storage_[pos].allocation;
        if (a.active()) {
            a.type_info().destroy(&storage_[pos+1]);
        }
        pos += a.size;
    }

    next_free_ = start_;
}